

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

char * __thiscall cmGeneratorTarget::GetLinkPIEProperty(cmGeneratorTarget *this,string *config)

{
  int iVar1;
  PolicyStatus PVar2;
  _Alloc_hider _Var3;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_ == '\0') {
    GetLinkPIEProperty();
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"POSITION_INDEPENDENT_CODE","");
  checkInterfacePropertyCompatibility<std::__cxx11::string>
            (&local_40,this,&local_60,config,"FALSE",BoolType,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::string::operator=
            ((string *)&GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_,
             (string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  iVar1 = std::__cxx11::string::compare
                    ((char *)&GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_);
  if ((iVar1 == 0) ||
     (PVar2 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0083),
     _Var3 = GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_._M_dataplus,
     PVar2 < NEW)) {
    _Var3._M_p = (char *)0x0;
  }
  return _Var3._M_p;
}

Assistant:

const char* cmGeneratorTarget::GetLinkPIEProperty(
  const std::string& config) const
{
  static std::string PICValue;

  PICValue = this->GetLinkInterfaceDependentStringAsBoolProperty(
    "POSITION_INDEPENDENT_CODE", config);

  if (PICValue == "(unset)") {
    // POSITION_INDEPENDENT_CODE is not set
    return nullptr;
  }

  auto status = this->GetPolicyStatusCMP0083();
  return (status != cmPolicies::WARN && status != cmPolicies::OLD)
    ? PICValue.c_str()
    : nullptr;
}